

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O2

void Vec_PtrRemove(Vec_Ptr_t *p,void *Entry)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = p->nSize;
  uVar3 = (ulong)uVar1;
  do {
    if ((int)uVar3 < 1) {
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x304,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
    }
    uVar4 = uVar3 - 1;
    lVar2 = uVar3 - 1;
    uVar3 = uVar4;
  } while (p->pArray[lVar2] != Entry);
  while (uVar3 = uVar4 + 1, (int)uVar3 < (int)uVar1) {
    p->pArray[uVar4] = p->pArray[uVar3];
    uVar4 = uVar3;
  }
  p->nSize = uVar1 - 1;
  return;
}

Assistant:

static inline void Vec_PtrRemove( Vec_Ptr_t * p, void * Entry )
{
    int i;
    // delete assuming that it is closer to the end
    for ( i = p->nSize - 1; i >= 0; i-- )
        if ( p->pArray[i] == Entry )
            break;
    assert( i >= 0 );
/*
    // delete assuming that it is closer to the beginning
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            break;
    assert( i < p->nSize );
*/
    for ( i++; i < p->nSize; i++ )
        p->pArray[i-1] = p->pArray[i];
    p->nSize--;
}